

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t masked_compound_type_rd
                  (AV1_COMP *cpi,MACROBLOCK *x,int_mv *cur_mv,BLOCK_SIZE bsize,
                  PREDICTION_MODE this_mode,int *rs2,int rate_mv,BUFFER_SET *ctx,int *out_rate_mv,
                  uint8_t **preds0,uint8_t **preds1,int16_t *residual1,int16_t *diff10,int *strides,
                  int mode_rate,int64_t rd_thresh,int *calc_pred_masked_compound,int32_t *comp_rate,
                  int64_t *comp_dist,int32_t *comp_model_rate,int64_t *comp_model_dist,
                  int64_t comp_best_model_rd,int64_t *comp_model_rd_cur,int *comp_rs2,
                  int64_t ref_skip_rd)

{
  long lVar1;
  ulong uVar2;
  BLOCK_SIZE bsize_00;
  BLOCK_SIZE BVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  int64_t *plane_dist;
  MACROBLOCK *x_00;
  MACROBLOCKD *xd_00;
  long lVar7;
  BLOCK_SIZE in_CL;
  undefined4 *in_RDX;
  long in_RSI;
  long *in_RDI;
  PREDICTION_MODE in_R8B;
  int *in_R9;
  int in_stack_00000008;
  int *in_stack_00000018;
  ulong *in_stack_00000020;
  ulong *in_stack_00000028;
  undefined8 in_stack_00000030;
  int64_t in_stack_00000038;
  int64_t tmp_rd_thresh;
  int64_t tmp_mode_rd;
  RD_STATS rd_stats;
  int64_t *in_stack_00000078;
  int mi_col;
  int mi_row;
  int wedge_newmv_search;
  int eval_txfm;
  int txfm_rd_gate_level;
  int64_t mode_rd;
  int64_t skip_rd_cur;
  uint64_t cur_sse;
  uint mse;
  uint sse;
  pick_interinter_mask_type pick_interinter_mask [2];
  int64_t tmp_skip_sse_sb;
  int64_t dist_sum;
  uint8_t tmp_skip_txfm_sb;
  int rate_sum;
  COMPOUND_TYPE compound_type;
  int64_t rd;
  int64_t best_rd_cur;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MB_MODE_INFO *mbmi_00;
  ModeCosts *in_stack_fffffffffffffec8;
  MACROBLOCK *in_stack_fffffffffffffed0;
  int16_t *in_stack_fffffffffffffed8;
  RD_STATS *rd_stats_00;
  int16_t *in_stack_fffffffffffffee0;
  int64_t ref_best_rd;
  uint8_t **in_stack_fffffffffffffee8;
  MACROBLOCK *x_01;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  BLOCK_SIZE BVar8;
  BUFFER_SET *in_stack_fffffffffffffef8;
  int_mv *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  AV1_COMP *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff40;
  undefined1 local_a8 [7];
  int_mv in_stack_ffffffffffffff60;
  int_mv in_stack_ffffffffffffff64;
  code *local_98;
  code *out_rate_sum;
  int64_t *in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  int64_t *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  undefined3 in_stack_ffffffffffffff94;
  uint uVar9;
  byte bVar10;
  COMPOUND_TYPE cur_type;
  int64_t *plane_sse;
  int64_t local_18;
  
  lVar1 = **(long **)(in_RSI + 0x2058);
  plane_sse = (int64_t *)0x7fffffffffffffff;
  uVar9 = CONCAT13(*(undefined1 *)(lVar1 + 0x53),in_stack_ffffffffffffff94);
  local_98 = pick_interinter_wedge;
  out_rate_sum = pick_interinter_seg;
  if (*(int *)rd_stats.dist != 0) {
    get_inter_predictors_masked_compound
              ((MACROBLOCK *)&in_stack_ffffffffffffff00->as_mv,
               (BLOCK_SIZE)((ulong)in_stack_fffffffffffffef8 >> 0x38),
               (uint8_t **)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (int *)in_stack_ffffffffffffff10);
    *(undefined4 *)rd_stats.dist = 0;
  }
  if ((char)(uVar9 >> 0x18) == '\x02') {
    iVar4 = is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
    if (iVar4 == 0) {
      (**(code **)(*in_RDI + (ulong)in_CL * 0x70 + 0xc918))
                (*in_stack_00000020,*(undefined4 *)tmp_rd_thresh,*in_stack_00000028,
                 *(undefined4 *)tmp_rd_thresh,&stack0xffffffffffffff64);
    }
    else {
      (**(code **)(*in_RDI + (ulong)in_CL * 0x70 + 0xc918))
                (*in_stack_00000020 >> 1,*(undefined4 *)tmp_rd_thresh,*in_stack_00000028 >> 1,
                 *(undefined4 *)tmp_rd_thresh,&stack0xffffffffffffff64);
    }
    in_stack_ffffffffffffff60.as_int =
         in_stack_ffffffffffffff64.as_int +
         ((1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[in_CL] & 0x1f)) >> 1)
         >> ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[in_CL] & 0x1f);
    if ((in_stack_ffffffffffffff60.as_int < 8) ||
       ((iVar4 = have_newmv_in_inter_mode(in_R8B), iVar4 == 0 &&
        (in_stack_ffffffffffffff60.as_int < 0x40)))) {
      *_eval_txfm = 0x7fffffffffffffff;
      return 0x7fffffffffffffff;
    }
  }
  _local_a8 = -1;
  mbmi_00 = (MB_MODE_INFO *)local_a8;
  puVar6 = (uint8_t *)
           (*(&local_98)[(int)((uVar9 >> 0x18) - 2)])
                     (in_RDI,in_RSI,in_CL,*in_stack_00000020,*in_stack_00000028,in_stack_00000030);
  iVar4 = get_interinter_compound_mask_rate(in_stack_fffffffffffffec8,mbmi_00);
  BVar8 = (BLOCK_SIZE)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  *in_R9 = iVar4 + *in_R9;
  plane_dist = (int64_t *)
               (puVar6 + ((long)(*in_R9 + in_stack_00000008) * (long)*(int *)(in_RSI + 0x4218) +
                          0x100 >> 9));
  x_00 = (MACROBLOCK *)
         (((long)(*in_R9 + in_stack_00000008) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
         _local_a8 * 0x800);
  xd_00 = (MACROBLOCKD *)
          ((long)(*in_R9 + (int)tmp_mode_rd) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9);
  if ((long)rd_stats._0_8_ < (long)xd_00) {
    *_eval_txfm = 0x7fffffffffffffff;
    local_18 = 0x7fffffffffffffff;
  }
  else {
    iVar4 = get_txfm_rd_gate_level
                      ((uint)*(byte *)(in_RDI[0x8401] + 0x3f),(int *)(in_RDI + 0xc14f),in_CL,'\x02',
                       0);
    if ((iVar4 == 0) ||
       (in_stack_ffffffffffffff40 =
             check_txfm_eval(in_stack_fffffffffffffed0,BVar8,(int64_t)mbmi_00,in_stack_00000038,0,
                             0x70a81a), in_stack_ffffffffffffff40 != 0)) {
      bVar10 = (byte)(uVar9 >> 0x18);
      if (*(int *)(rd_stats.rdcost + (ulong)bVar10 * 4) == 0x7fffffff) {
        iVar5 = have_newmv_in_inter_mode(in_R8B);
        BVar8 = BLOCK_4X4;
        if ((iVar5 != 0) && (BVar8 = BLOCK_4X4, (char)(uVar9 >> 0x18) == '\x02')) {
          BVar8 = (int)in_RDI[0xc15f] != 0 ^ BLOCK_INVALID;
        }
        BVar3 = BVar8 & BLOCK_4X8;
        if (BVar3 == BLOCK_4X4) {
          *in_stack_00000018 = in_stack_00000008;
          av1_build_wedge_inter_predictor_from_buf
                    ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                     (int)in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (uint8_t **)CONCAT17(BVar8,in_stack_fffffffffffffef0),
                     (int *)in_stack_fffffffffffffee8,
                     (uint8_t **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          iVar5 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        }
        else {
          iVar5 = av1_interinter_compound_motion_search
                            (in_stack_ffffffffffffff10,
                             (MACROBLOCK *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             in_stack_ffffffffffffff00,
                             (BLOCK_SIZE)((ulong)in_stack_fffffffffffffef8 >> 0x38),
                             (PREDICTION_MODE)((ulong)in_stack_fffffffffffffef8 >> 0x30));
          *in_stack_00000018 = iVar5;
          av1_enc_build_inter_predictor
                    ((AV1_COMMON *)in_stack_ffffffffffffff10,
                     (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8,BVar8,in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff28);
          iVar5 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        }
        lVar7 = _local_a8;
        rd_stats_00 = (RD_STATS *)0x0;
        ref_best_rd = 0;
        x_01 = (MACROBLOCK *)0x0;
        uVar2 = (ulong)_local_a8 >> 0x38;
        bsize_00 = (BLOCK_SIZE)uVar2;
        _local_a8 = lVar7;
        model_rd_for_sb_with_curvfit
                  ((AV1_COMP *)
                   CONCAT44(in_stack_ffffffffffffff64.as_int,in_stack_ffffffffffffff60.as_int),
                   bsize_00,x_00,xd_00,iVar4,in_stack_ffffffffffffff40,(int *)out_rate_sum,
                   in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                   (int *)CONCAT44(uVar9,in_stack_ffffffffffffff90),plane_sse,plane_dist);
        cur_type = (COMPOUND_TYPE)(uVar9 >> 0x18);
        lVar7 = ((long)(*in_R9 + *in_stack_00000018 + in_stack_ffffffffffffff90) *
                 (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                (long)in_stack_ffffffffffffff80 * 0x80;
        *_eval_txfm = lVar7;
        if ((BVar3 != BLOCK_4X4) && ((long)plane_dist <= lVar7)) {
          *(undefined4 *)(lVar1 + 8) = *in_RDX;
          *(undefined4 *)(lVar1 + 0xc) = in_RDX[1];
          *in_stack_00000018 = in_stack_00000008;
          av1_build_wedge_inter_predictor_from_buf
                    ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                     (int)in_stack_ffffffffffffff00,iVar5,
                     (uint8_t **)CONCAT17(BVar8,in_stack_fffffffffffffef0),(int *)x_01,
                     (uint8_t **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          *_eval_txfm = (long)plane_dist;
        }
        if (((*(int *)((long)in_RDI + 0x60ab4) == 0) || (*_eval_txfm <= _mi_row)) ||
           (_mi_row == 0x7fffffffffffffff)) {
          local_18 = estimate_yrd_for_sb((AV1_COMP *)
                                         (rd_stats._0_8_ -
                                         ((long)(*in_R9 + *in_stack_00000018) *
                                          (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9)),BVar8,x_01,
                                         ref_best_rd,rd_stats_00);
          if (local_18 != 0x7fffffffffffffff) {
            local_18 = ((long)(*in_R9 + *in_stack_00000018 + in_stack_ffffffffffffff08) *
                        (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                       (long)in_stack_ffffffffffffff10 * 0x80;
            backup_stats(cur_type,(int32_t *)rd_stats.rdcost,(int64_t *)rd_stats.sse,
                         (int32_t *)rd_stats._32_8_,in_stack_00000078,in_stack_ffffffffffffff90,
                         (int64_t)in_stack_ffffffffffffff80,(RD_STATS *)&stack0xffffffffffffff08,
                         (int *)mode_rd,*in_R9);
          }
        }
        else {
          *_eval_txfm = 0x7fffffffffffffff;
          local_18 = 0x7fffffffffffffff;
        }
      }
      else {
        *in_stack_00000018 = in_stack_00000008;
        local_18 = ((long)(*in_R9 + *in_stack_00000018 +
                          *(int *)(rd_stats.rdcost + (ulong)bVar10 * 4)) *
                    (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                   *(long *)(rd_stats.sse + (ulong)bVar10 * 8) * 0x80;
        *_eval_txfm = ((long)(*in_R9 + *in_stack_00000018 +
                             *(int *)(rd_stats._32_8_ + (ulong)bVar10 * 4)) *
                       (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                      in_stack_00000078[bVar10] * 0x80;
      }
    }
    else {
      *_eval_txfm = 0x7fffffffffffffff;
      local_18 = 0x7fffffffffffffff;
    }
  }
  return local_18;
}

Assistant:

static int64_t masked_compound_type_rd(
    const AV1_COMP *const cpi, MACROBLOCK *x, const int_mv *const cur_mv,
    const BLOCK_SIZE bsize, const PREDICTION_MODE this_mode, int *rs2,
    int rate_mv, const BUFFER_SET *ctx, int *out_rate_mv, uint8_t **preds0,
    uint8_t **preds1, int16_t *residual1, int16_t *diff10, int *strides,
    int mode_rate, int64_t rd_thresh, int *calc_pred_masked_compound,
    int32_t *comp_rate, int64_t *comp_dist, int32_t *comp_model_rate,
    int64_t *comp_model_dist, const int64_t comp_best_model_rd,
    int64_t *const comp_model_rd_cur, int *comp_rs2, int64_t ref_skip_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int64_t best_rd_cur = INT64_MAX;
  int64_t rd = INT64_MAX;
  const COMPOUND_TYPE compound_type = mbmi->interinter_comp.type;
  // This function will be called only for COMPOUND_WEDGE and COMPOUND_DIFFWTD
  assert(compound_type == COMPOUND_WEDGE || compound_type == COMPOUND_DIFFWTD);
  int rate_sum;
  uint8_t tmp_skip_txfm_sb;
  int64_t dist_sum, tmp_skip_sse_sb;
  pick_interinter_mask_type pick_interinter_mask[2] = { pick_interinter_wedge,
                                                        pick_interinter_seg };

  // TODO(any): Save pred and mask calculation as well into records. However
  // this may increase memory requirements as compound segment mask needs to be
  // stored in each record.
  if (*calc_pred_masked_compound) {
    get_inter_predictors_masked_compound(x, bsize, preds0, preds1, residual1,
                                         diff10, strides);
    *calc_pred_masked_compound = 0;
  }
  if (compound_type == COMPOUND_WEDGE) {
    unsigned int sse;
    if (is_cur_buf_hbd(xd))
      (void)cpi->ppi->fn_ptr[bsize].vf(CONVERT_TO_BYTEPTR(*preds0), *strides,
                                       CONVERT_TO_BYTEPTR(*preds1), *strides,
                                       &sse);
    else
      (void)cpi->ppi->fn_ptr[bsize].vf(*preds0, *strides, *preds1, *strides,
                                       &sse);
    const unsigned int mse =
        ROUND_POWER_OF_TWO(sse, num_pels_log2_lookup[bsize]);
    // If two predictors are very similar, skip wedge compound mode search
    if (mse < 8 || (!have_newmv_in_inter_mode(this_mode) && mse < 64)) {
      *comp_model_rd_cur = INT64_MAX;
      return INT64_MAX;
    }
  }
  // Function pointer to pick the appropriate mask
  // compound_type == COMPOUND_WEDGE, calls pick_interinter_wedge()
  // compound_type == COMPOUND_DIFFWTD, calls pick_interinter_seg()
  uint64_t cur_sse = UINT64_MAX;
  best_rd_cur = pick_interinter_mask[compound_type - COMPOUND_WEDGE](
      cpi, x, bsize, *preds0, *preds1, residual1, diff10, &cur_sse);
  *rs2 += get_interinter_compound_mask_rate(&x->mode_costs, mbmi);
  best_rd_cur += RDCOST(x->rdmult, *rs2 + rate_mv, 0);
  assert(cur_sse != UINT64_MAX);
  int64_t skip_rd_cur = RDCOST(x->rdmult, *rs2 + rate_mv, (cur_sse << 4));

  // Although the true rate_mv might be different after motion search, but it
  // is unlikely to be the best mode considering the transform rd cost and other
  // mode overhead cost
  int64_t mode_rd = RDCOST(x->rdmult, *rs2 + mode_rate, 0);
  if (mode_rd > rd_thresh) {
    *comp_model_rd_cur = INT64_MAX;
    return INT64_MAX;
  }

  // Check if the mode is good enough based on skip rd
  // TODO(nithya): Handle wedge_newmv_search if extending for lower speed
  // setting
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cm->seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_COMP_TYPE_MODE, /*eval_motion_mode=*/0);
  if (txfm_rd_gate_level) {
    int eval_txfm = check_txfm_eval(x, bsize, ref_skip_rd, skip_rd_cur,
                                    txfm_rd_gate_level, 1);
    if (!eval_txfm) {
      *comp_model_rd_cur = INT64_MAX;
      return INT64_MAX;
    }
  }

  // Compute cost if matching record not found, else, reuse data
  if (comp_rate[compound_type] == INT_MAX) {
    // Check whether new MV search for wedge is to be done
    int wedge_newmv_search =
        have_newmv_in_inter_mode(this_mode) &&
        (compound_type == COMPOUND_WEDGE) &&
        (!cpi->sf.inter_sf.disable_interinter_wedge_newmv_search);

    // Search for new MV if needed and build predictor
    if (wedge_newmv_search) {
      *out_rate_mv = av1_interinter_compound_motion_search(cpi, x, cur_mv,
                                                           bsize, this_mode);
      const int mi_row = xd->mi_row;
      const int mi_col = xd->mi_col;
      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, ctx, bsize,
                                    AOM_PLANE_Y, AOM_PLANE_Y);
    } else {
      *out_rate_mv = rate_mv;
      av1_build_wedge_inter_predictor_from_buf(xd, bsize, 0, 0, preds0, strides,
                                               preds1, strides);
    }
    // Get the RD cost from model RD
    model_rd_sb_fn[MODELRD_TYPE_MASKED_COMPOUND](
        cpi, bsize, x, xd, 0, 0, &rate_sum, &dist_sum, &tmp_skip_txfm_sb,
        &tmp_skip_sse_sb, NULL, NULL, NULL);
    rd = RDCOST(x->rdmult, *rs2 + *out_rate_mv + rate_sum, dist_sum);
    *comp_model_rd_cur = rd;
    // Override with best if current is worse than best for new MV
    if (wedge_newmv_search) {
      if (rd >= best_rd_cur) {
        mbmi->mv[0].as_int = cur_mv[0].as_int;
        mbmi->mv[1].as_int = cur_mv[1].as_int;
        *out_rate_mv = rate_mv;
        av1_build_wedge_inter_predictor_from_buf(xd, bsize, 0, 0, preds0,
                                                 strides, preds1, strides);
        *comp_model_rd_cur = best_rd_cur;
      }
    }
    if (cpi->sf.inter_sf.prune_comp_type_by_model_rd &&
        (*comp_model_rd_cur > comp_best_model_rd) &&
        comp_best_model_rd != INT64_MAX) {
      *comp_model_rd_cur = INT64_MAX;
      return INT64_MAX;
    }
    // Compute RD cost for the current type
    RD_STATS rd_stats;
    const int64_t tmp_mode_rd = RDCOST(x->rdmult, *rs2 + *out_rate_mv, 0);
    const int64_t tmp_rd_thresh = rd_thresh - tmp_mode_rd;
    rd = estimate_yrd_for_sb(cpi, bsize, x, tmp_rd_thresh, &rd_stats);
    if (rd != INT64_MAX) {
      rd =
          RDCOST(x->rdmult, *rs2 + *out_rate_mv + rd_stats.rate, rd_stats.dist);
      // Backup rate and distortion for future reuse
      backup_stats(compound_type, comp_rate, comp_dist, comp_model_rate,
                   comp_model_dist, rate_sum, dist_sum, &rd_stats, comp_rs2,
                   *rs2);
    }
  } else {
    // Reuse data as matching record is found
    assert(comp_dist[compound_type] != INT64_MAX);
    // When disable_interinter_wedge_newmv_search is set, motion refinement is
    // disabled. Hence rate and distortion can be reused in this case as well
    assert(IMPLIES((have_newmv_in_inter_mode(this_mode) &&
                    (compound_type == COMPOUND_WEDGE)),
                   cpi->sf.inter_sf.disable_interinter_wedge_newmv_search));
    assert(mbmi->mv[0].as_int == cur_mv[0].as_int);
    assert(mbmi->mv[1].as_int == cur_mv[1].as_int);
    *out_rate_mv = rate_mv;
    // Calculate RD cost based on stored stats
    rd = RDCOST(x->rdmult, *rs2 + *out_rate_mv + comp_rate[compound_type],
                comp_dist[compound_type]);
    // Recalculate model rdcost with the updated rate
    *comp_model_rd_cur =
        RDCOST(x->rdmult, *rs2 + *out_rate_mv + comp_model_rate[compound_type],
               comp_model_dist[compound_type]);
  }
  return rd;
}